

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogTest.cpp
# Opt level: O2

int LogTest(int argc,char **argv)

{
  allocator<char> local_c439;
  string local_c438;
  string local_c418;
  Log log;
  Trace trace;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c438,"logTest.txt",(allocator<char> *)&local_c418);
  BuildRelativeOutputPath((string *)&trace,argv,&local_c438);
  Log::Log(&log,(string *)&trace,true);
  std::__cxx11::string::~string((string *)&trace);
  std::__cxx11::string::~string((string *)&local_c438);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&trace,"testing wide string input",(allocator<char> *)&local_c438);
  Log::LogEntry(&log,(string *)&trace);
  std::__cxx11::string::~string((string *)&trace);
  Log::LogEntry(&log,(Byte *)"testing Byte input",0x12);
  Trace::Trace(&trace);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c418,"traceTest.txt",&local_c439);
  BuildRelativeOutputPath(&local_c438,argv,&local_c418);
  Trace::SetLogSettings(&trace,&local_c438,true,true);
  std::__cxx11::string::~string((string *)&local_c438);
  std::__cxx11::string::~string((string *)&local_c418);
  Trace::TraceToLog(&trace,"Tracing number %d %d",10,0x14);
  Trace::TraceToLog(&trace,"Tracing some other items %s 0x%x","hello",0x14);
  Trace::~Trace(&trace);
  Log::~Log(&log);
  return 0;
}

Assistant:

int LogTest(int argc, char* argv[])
{
	Log log(BuildRelativeOutputPath(argv,"logTest.txt"),true);

	log.LogEntry("testing wide string input");

	const char* aString = "testing Byte input";

	log.LogEntry((const Byte*)aString,strlen(aString));


	Trace trace;

	trace.SetLogSettings(BuildRelativeOutputPath(argv,"traceTest.txt"),true,true);
	trace.TraceToLog("Tracing number %d %d",10,20);
	trace.TraceToLog("Tracing some other items %s 0x%x","hello",20);

	return 0;
}